

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O1

void __thiscall
icu_63::ContractionsAndExpansions::handlePrefixes
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  ushort uVar1;
  UChar *pUVar2;
  UBool UVar3;
  ushort uVar4;
  ulong uVar5;
  Iterator prefixes;
  ConstChar16Ptr local_c0;
  UChar *local_b8;
  Iterator local_a8;
  
  pUVar2 = this->data->contexts;
  uVar5 = (ulong)(ce32 >> 0xd);
  handleCE32(this,start,end,CONCAT22(pUVar2[uVar5],pUVar2[uVar5 + 1]));
  if (this->addPrefixes != '\0') {
    local_c0.p_ = pUVar2 + uVar5 + 2;
    UCharsTrie::Iterator::Iterator(&local_a8,&local_c0,0,&this->errorCode);
    local_b8 = local_c0.p_;
    while( true ) {
      UVar3 = UCharsTrie::Iterator::next(&local_a8,&this->errorCode);
      if (UVar3 == '\0') break;
      setPrefix(this,&local_a8.str_);
      addStrings(this,start,end,this->contractions);
      addStrings(this,start,end,this->expansions);
      handleCE32(this,start,end,local_a8.value_);
    }
    uVar1 = (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags;
    uVar4 = 2;
    if ((uVar1 & 1) == 0) {
      uVar4 = uVar1 & 0x1e;
    }
    (this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags = uVar4;
    UCharsTrie::Iterator::~Iterator(&local_a8);
  }
  return;
}

Assistant:

void
ContractionsAndExpansions::handlePrefixes(
        UChar32 start, UChar32 end, uint32_t ce32) {
    const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
    ce32 = CollationData::readCE32(p);  // Default if no prefix match.
    handleCE32(start, end, ce32);
    if(!addPrefixes) { return; }
    UCharsTrie::Iterator prefixes(p + 2, 0, errorCode);
    while(prefixes.next(errorCode)) {
        setPrefix(prefixes.getString());
        // Prefix/pre-context mappings are special kinds of contractions
        // that always yield expansions.
        addStrings(start, end, contractions);
        addStrings(start, end, expansions);
        handleCE32(start, end, (uint32_t)prefixes.getValue());
    }
    resetPrefix();
}